

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O1

void Bac_ManWriteBlifArray2(FILE *pFile,Bac_Ntk_t *p,int iObj)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  Bac_Ntk_t *p_00;
  
  if ((-1 < iObj) && (iObj < (p->vType).nSize)) {
    if (((byte)(p->vType).pArray[(uint)iObj] >> 1) - 0x49 < 0xffffffbc) {
      __assert_fail("Bac_ObjIsBox(p, i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                    ,0x13d,"int Bac_BoxNtkId(Bac_Ntk_t *, int)");
    }
    if ((p->vFanin).nSize <= iObj) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar4 = (p->vFanin).pArray[(uint)iObj];
    if (((long)iVar4 < 1) || (p->pDesign->nNtks < iVar4)) {
      p_00 = (Bac_Ntk_t *)0x0;
    }
    else {
      p_00 = p->pDesign->pNtks + iVar4;
    }
    if (0 < (p_00->vInputs).nSize) {
      iVar4 = iObj + -1;
      lVar3 = 0;
      do {
        pcVar1 = Bac_ObjNameStr(p_00,(p_00->vInputs).pArray[lVar3]);
        if ((p->vType).nSize <= iObj) goto LAB_003c5aa9;
        if (((byte)(p->vType).pArray[(uint)iObj] >> 1) - 0x49 < 0xffffffbc) {
          __assert_fail("Bac_ObjIsBox(p, b)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0x133,"int Bac_BoxBi(Bac_Ntk_t *, int, int)");
        }
        pcVar2 = Bac_ObjNameStr(p,iVar4);
        fprintf((FILE *)pFile," %s=%s",pcVar1,pcVar2);
        lVar3 = lVar3 + 1;
        iVar4 = iVar4 + -1;
      } while (lVar3 < (p_00->vInputs).nSize);
    }
    if (0 < (p_00->vOutputs).nSize) {
      lVar3 = 0;
      do {
        pcVar1 = Bac_ObjNameStr(p_00,(p_00->vOutputs).pArray[lVar3]);
        if ((p->vType).nSize <= iObj) goto LAB_003c5aa9;
        if (((byte)(p->vType).pArray[(uint)iObj] >> 1) - 0x49 < 0xffffffbc) {
          __assert_fail("Bac_ObjIsBox(p, b)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0x134,"int Bac_BoxBo(Bac_Ntk_t *, int, int)");
        }
        pcVar2 = Bac_ObjNameStr(p,(int)lVar3 + iObj + 1);
        fprintf((FILE *)pFile," %s=%s",pcVar1,pcVar2);
        lVar3 = lVar3 + 1;
      } while (lVar3 < (p_00->vOutputs).nSize);
    }
    fputc(10,(FILE *)pFile);
    return;
  }
LAB_003c5aa9:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

void Bac_ManWriteBlifArray2( FILE * pFile, Bac_Ntk_t * p, int iObj )
{
    int iTerm, i;
    Bac_Ntk_t * pModel = Bac_BoxNtk( p, iObj );
    Bac_NtkForEachPi( pModel, iTerm, i )
        fprintf( pFile, " %s=%s", Bac_ObjNameStr(pModel, iTerm), Bac_ObjNameStr(p, Bac_BoxBi(p, iObj, i)) );
    Bac_NtkForEachPo( pModel, iTerm, i )
        fprintf( pFile, " %s=%s", Bac_ObjNameStr(pModel, iTerm), Bac_ObjNameStr(p, Bac_BoxBo(p, iObj, i)) );
    fprintf( pFile, "\n" );
}